

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VaultClient.h
# Opt level: O0

void __thiscall Vault::TlsStrategy::~TlsStrategy(TlsStrategy *this)

{
  TlsStrategy *this_local;
  
  ~TlsStrategy(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

explicit TlsStrategy(Certificate cert, Certificate key)
      : cert_(std::move(cert)), key_(std::move(key)) {}